

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TemporaryObject.cpp
# Opt level: O1

EvaluationResult __thiscall
chatra::TemporaryObject::evaluateAsPackageInitCall(TemporaryObject *this)

{
  bool bVar1;
  ScopeType SVar2;
  pointer pFVar3;
  Package *pPVar4;
  pointer pAVar5;
  Method *pMVar6;
  vector<chatra::ArgumentSpec,_std::allocator<chatra::ArgumentSpec>_> *pvVar7;
  size_t sVar8;
  MethodTable *this_00;
  vector<chatra::ArgumentSpec,_std::allocator<chatra::ArgumentSpec>_> local_58;
  vector<chatra::ArgumentSpec,_std::allocator<chatra::ArgumentSpec>_> *local_40;
  size_t local_38;
  
  pvVar7 = &this->args;
  sVar8 = ((long)(this->thread->frames).
                 super__Vector_base<chatra::Frame,_std::allocator<chatra::Frame>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)(this->thread->frames).
                 super__Vector_base<chatra::Frame,_std::allocator<chatra::Frame>_>._M_impl.
                 super__Vector_impl_data._M_start >> 4) * -0xf0f0f0f0f0f0f0f - 1;
  local_40 = pvVar7;
  do {
    if (sVar8 == 0xffffffffffffffff) {
      return Failed;
    }
    pFVar3 = (this->thread->frames).
             super__Vector_base<chatra::Frame,_std::allocator<chatra::Frame>_>._M_impl.
             super__Vector_impl_data._M_start;
    SVar2 = (pFVar3[sVar8].scope)->type;
    if (SVar2 == Package) {
      this_00 = (MethodTable *)
                ((long)((pFVar3[sVar8].package)->clPackage)._M_t.
                       super___uniq_ptr_impl<chatra::Class,_std::default_delete<chatra::Class>_>.
                       _M_t + 0x268);
      local_58.super__Vector_base<chatra::ArgumentSpec,_std::allocator<chatra::ArgumentSpec>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_58.super__Vector_base<chatra::ArgumentSpec,_std::allocator<chatra::ArgumentSpec>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_58.super__Vector_base<chatra::ArgumentSpec,_std::allocator<chatra::ArgumentSpec>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_38 = sVar8;
      pMVar6 = MethodTable::find(this_00,(Class *)0x0,this->name,Invalid,local_40,&local_58);
      if (local_58.super__Vector_base<chatra::ArgumentSpec,_std::allocator<chatra::ArgumentSpec>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_58.
                        super__Vector_base<chatra::ArgumentSpec,_std::allocator<chatra::ArgumentSpec>_>
                        ._M_impl.super__Vector_impl_data._M_start);
      }
      pvVar7 = (vector<chatra::ArgumentSpec,_std::allocator<chatra::ArgumentSpec>_> *)0x1;
      if (((pMVar6 != (Method *)0x0) && (pMVar6->position == 0xffffffffffffffff)) &&
         ((pMVar6->super_MethodBase).node != (Node *)0x0)) {
        pPVar4 = pFVar3[sVar8].package;
        bVar1 = this->hasArgs;
        this->type = FrameMethod;
        (this->targetRef).node = (ReferenceNode *)0x0;
        this->frameIndex = 0xffffffffffffffff;
        this->package = pPVar4;
        this->methodTable = this_00;
        this->method0 = pMVar6;
        this->method1 = (Method *)0x0;
        this->methodHasArgs = bVar1;
        this->hasName = false;
        this->hasArgs = false;
        this->hasSetArg = false;
        this->hasVarArgOp = false;
        pAVar5 = (this->args).
                 super__Vector_base<chatra::ArgumentSpec,_std::allocator<chatra::ArgumentSpec>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        if ((this->args).
            super__Vector_base<chatra::ArgumentSpec,_std::allocator<chatra::ArgumentSpec>_>._M_impl.
            super__Vector_impl_data._M_finish != pAVar5) {
          (this->args).
          super__Vector_base<chatra::ArgumentSpec,_std::allocator<chatra::ArgumentSpec>_>._M_impl.
          super__Vector_impl_data._M_finish = pAVar5;
        }
        resolveNativeMethod(this,this->name,Invalid);
        pvVar7 = (vector<chatra::ArgumentSpec,_std::allocator<chatra::ArgumentSpec>_> *)0x0;
      }
    }
    else {
      local_38 = pFVar3[sVar8].parentIndex;
    }
    sVar8 = local_38;
  } while (SVar2 != Package);
  return (EvaluationResult)pvVar7;
}

Assistant:

TemporaryObject::EvaluationResult TemporaryObject::evaluateAsPackageInitCall() {
	chatra_assert(requiresEvaluate());
	chatra_assert(!hasRef());
	chatra_assert(type == Type::Empty && hasName && name == StringId::Init && !hasArgs);

	size_t frameIndex = thread.frames.size() - 1;
	while (frameIndex != SIZE_MAX) {
		auto& f = thread.frames[frameIndex];
		if (f.scope->getScopeType() != ScopeType::Package) {
			frameIndex = f.parentIndex;
			continue;
		}

		auto& table = f.package.clPackage->refConstructors();
		auto* refMethod = table.find(nullptr, name, StringId::Invalid, args, {});
		if (refMethod == nullptr || refMethod->position != SIZE_MAX || refMethod->node == nullptr)
			return EvaluationResult::Failed;

		setFrameMethod(SIZE_MAX, &f.package, &table, refMethod, nullptr, hasArgs);
		resolveNativeMethod(name, StringId::Invalid);
		return EvaluationResult::Succeeded;
	}

	return EvaluationResult::Failed;
}